

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O0

Flow * __thiscall
wasm::ExpressionRunner<wasm::PrecomputingExpressionRunner>::visitBreak
          (Flow *__return_storage_ptr__,ExpressionRunner<wasm::PrecomputingExpressionRunner> *this,
          Break *curr)

{
  bool bVar1;
  Literal *this_00;
  int64_t iVar2;
  undefined1 local_110 [8];
  Flow conditionFlow;
  Flow local_b8;
  undefined1 local_70 [8];
  Flow flow;
  bool condition;
  Break *curr_local;
  ExpressionRunner<wasm::PrecomputingExpressionRunner> *this_local;
  
  flow.breakTo.super_IString.str._M_str._7_1_ = 1;
  Flow::Flow((Flow *)local_70);
  if (curr->value != (Expression *)0x0) {
    visit(&local_b8,this,curr->value);
    Flow::operator=((Flow *)local_70,&local_b8);
    Flow::~Flow(&local_b8);
    bVar1 = Flow::breaking((Flow *)local_70);
    if (bVar1) {
      Flow::Flow(__return_storage_ptr__,(Flow *)local_70);
      conditionFlow.breakTo.super_IString.str._M_str._0_4_ = 1;
      goto LAB_02007c7b;
    }
  }
  if (curr->condition != (Expression *)0x0) {
    visit((Flow *)local_110,this,curr->condition);
    bVar1 = Flow::breaking((Flow *)local_110);
    if (bVar1) {
      Flow::Flow(__return_storage_ptr__,(Flow *)local_110);
      conditionFlow.breakTo.super_IString.str._M_str._0_4_ = 1;
    }
    else {
      this_00 = Flow::getSingleValue((Flow *)local_110);
      iVar2 = wasm::Literal::getInteger(this_00);
      flow.breakTo.super_IString.str._M_str._7_1_ = iVar2 != 0;
      if ((bool)flow.breakTo.super_IString.str._M_str._7_1_) {
        conditionFlow.breakTo.super_IString.str._M_str._0_4_ = 0;
      }
      else {
        Flow::Flow(__return_storage_ptr__,(Flow *)local_70);
        conditionFlow.breakTo.super_IString.str._M_str._0_4_ = 1;
      }
    }
    Flow::~Flow((Flow *)local_110);
    if ((int)conditionFlow.breakTo.super_IString.str._M_str != 0) goto LAB_02007c7b;
  }
  wasm::Name::operator=
            ((Name *)((long)&flow.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
                             super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>.
                             _M_impl.super__Vector_impl_data + 0x10),&curr->name);
  Flow::Flow(__return_storage_ptr__,(Flow *)local_70);
  conditionFlow.breakTo.super_IString.str._M_str._0_4_ = 1;
LAB_02007c7b:
  Flow::~Flow((Flow *)local_70);
  return __return_storage_ptr__;
}

Assistant:

Flow visitBreak(Break* curr) {
    NOTE_ENTER("Break");
    bool condition = true;
    Flow flow;
    if (curr->value) {
      flow = visit(curr->value);
      if (flow.breaking()) {
        return flow;
      }
    }
    if (curr->condition) {
      Flow conditionFlow = visit(curr->condition);
      if (conditionFlow.breaking()) {
        return conditionFlow;
      }
      condition = conditionFlow.getSingleValue().getInteger() != 0;
      if (!condition) {
        return flow;
      }
    }
    flow.breakTo = curr->name;
    return flow;
  }